

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Nes_Apu.cpp
# Opt level: O0

void __thiscall Nes_Apu::Nes_Apu(Nes_Apu *this)

{
  Nes_Apu *in_RDI;
  Nes_Apu *unaff_retaddr;
  double in_stack_ffffffffffffffe8;
  Nes_Apu *buffer;
  
  buffer = in_RDI;
  Nes_Noise::Nes_Noise((Nes_Noise *)0x11ac1f);
  Nes_Triangle::Nes_Triangle((Nes_Triangle *)0x11ac30);
  Nes_Dmc::Nes_Dmc((Nes_Dmc *)0x11ac41);
  Blip_Synth<3,_15>::Blip_Synth((Blip_Synth<3,_15> *)in_RDI);
  (in_RDI->dmc).apu = in_RDI;
  (in_RDI->dmc).rom_reader = (_func_int_void_ptr_cpu_addr_t *)0x0;
  (in_RDI->square1).synth = &in_RDI->square_synth;
  (in_RDI->square2).synth = &in_RDI->square_synth;
  in_RDI->irq_notifier_ = (_func_void_void_ptr *)0x0;
  in_RDI->oscs[0] = (Nes_Osc *)&in_RDI->square1;
  in_RDI->oscs[1] = (Nes_Osc *)&in_RDI->square2;
  in_RDI->oscs[2] = &(in_RDI->triangle).super_Nes_Osc;
  in_RDI->oscs[3] = (Nes_Osc *)&in_RDI->noise;
  in_RDI->oscs[4] = &(in_RDI->dmc).super_Nes_Osc;
  output(unaff_retaddr,(Blip_Buffer *)buffer);
  volume(in_RDI,in_stack_ffffffffffffffe8);
  reset(unaff_retaddr,SUB81((ulong)buffer >> 0x38,0),(int)buffer);
  return;
}

Assistant:

Nes_Apu::Nes_Apu()
{
	dmc.apu = this;
	dmc.rom_reader = NULL;
	square1.synth = &square_synth;
	square2.synth = &square_synth;
	irq_notifier_ = NULL;
	
	oscs [0] = &square1;
	oscs [1] = &square2;
	oscs [2] = &triangle;
	oscs [3] = &noise;
	oscs [4] = &dmc;
	
	output( NULL );
	volume( 1.0 );
	reset( false );
}